

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBExtractAlphaRow_C(uint8_t *src_argb,uint8_t *dst_a,int width)

{
  int iVar1;
  
  if (1 < width) {
    iVar1 = 0;
    do {
      *dst_a = src_argb[3];
      dst_a[1] = src_argb[7];
      dst_a = dst_a + 2;
      src_argb = src_argb + 8;
      iVar1 = iVar1 + 2;
    } while (iVar1 < width + -1);
  }
  if ((width & 1U) != 0) {
    *dst_a = src_argb[3];
  }
  return;
}

Assistant:

void ARGBExtractAlphaRow_C(const uint8_t* src_argb, uint8_t* dst_a, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst_a[0] = src_argb[3];
    dst_a[1] = src_argb[7];
    dst_a += 2;
    src_argb += 8;
  }
  if (width & 1) {
    dst_a[0] = src_argb[3];
  }
}